

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pss_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  int iVar2;
  ulong slen_00;
  size_t sVar3;
  undefined1 *puVar4;
  int local_dc;
  undefined1 local_d8 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t msb;
  ulong uStack_a8;
  int ret;
  size_t offset;
  size_t hlen;
  size_t min_slen;
  size_t slen;
  uchar salt [64];
  uchar *p;
  size_t olen;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  salt._56_8_ = sig;
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    __n = ctx->len;
    olen._4_4_ = hashlen;
    if (md_alg != MBEDTLS_MD_NONE) {
      md_ctx.hmac_ctx = mbedtls_md_info_from_type(md_alg);
      if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      olen._4_4_ = (uint)bVar1;
    }
    md_ctx.hmac_ctx = mbedtls_md_info_from_type(ctx->hash_id);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      slen_00 = (ulong)bVar1;
      if (__n < slen_00 * 2) {
        ctx_local._4_4_ = -0x4080;
      }
      else {
        min_slen = slen_00;
        if (__n < slen_00 * 2 + 2) {
          min_slen = (__n - slen_00) - 2;
        }
        memset(sig,0,__n);
        iVar2 = (*f_rng)(p_rng,(uchar *)&slen,min_slen);
        if (iVar2 == 0) {
          sVar3 = mbedtls_mpi_bitlen(&ctx->N);
          puVar4 = (undefined1 *)(((__n - slen_00) - min_slen) + -2 + salt._56_8_);
          salt._56_8_ = puVar4 + 1;
          *puVar4 = 1;
          memcpy((void *)salt._56_8_,&slen,min_slen);
          salt._56_8_ = min_slen + salt._56_8_;
          mbedtls_md_init((mbedtls_md_context_t *)local_d8);
          msb._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)local_d8,
                                       (mbedtls_md_info_t *)md_ctx.hmac_ctx,0);
          if ((((msb._4_4_ == 0) &&
               (msb._4_4_ = mbedtls_md_starts((mbedtls_md_context_t *)local_d8), msb._4_4_ == 0)) &&
              (msb._4_4_ = mbedtls_md_update((mbedtls_md_context_t *)local_d8,(uchar *)salt._56_8_,8
                                            ), msb._4_4_ == 0)) &&
             (((msb._4_4_ = mbedtls_md_update((mbedtls_md_context_t *)local_d8,hash,
                                              (ulong)olen._4_4_), msb._4_4_ == 0 &&
               (msb._4_4_ = mbedtls_md_update((mbedtls_md_context_t *)local_d8,(uchar *)&slen,
                                              min_slen), msb._4_4_ == 0)) &&
              (msb._4_4_ = mbedtls_md_finish((mbedtls_md_context_t *)local_d8,(uchar *)salt._56_8_),
              msb._4_4_ == 0)))) {
            uStack_a8 = (ulong)((sVar3 - 1 & 7) == 0);
            msb._4_4_ = mgf_mask(sig + uStack_a8,((__n - slen_00) + -1) - uStack_a8,
                                 (uchar *)salt._56_8_,slen_00,(mbedtls_md_context_t *)local_d8);
            if (msb._4_4_ == 0) {
              sVar3 = mbedtls_mpi_bitlen(&ctx->N);
              *sig = *sig & (byte)(0xff >> ((char)(__n << 3) - ((char)sVar3 + -1) & 0x1fU));
              puVar4 = (undefined1 *)(slen_00 + salt._56_8_);
              salt._56_8_ = puVar4 + 1;
              *puVar4 = 0xbc;
              mbedtls_platform_zeroize(&slen,0x40);
            }
          }
          mbedtls_md_free((mbedtls_md_context_t *)local_d8);
          if (msb._4_4_ == 0) {
            if (mode == 0) {
              local_dc = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              local_dc = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,sig);
            }
            ctx_local._4_4_ = local_dc;
          }
          else {
            ctx_local._4_4_ = msb._4_4_;
          }
        }
        else {
          ctx_local._4_4_ = iVar2 + -0x4480;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pss_sign( mbedtls_rsa_context *ctx,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng,
                         int mode,
                         mbedtls_md_type_t md_alg,
                         unsigned int hashlen,
                         const unsigned char *hash,
                         unsigned char *sig )
{
    size_t olen;
    unsigned char *p = sig;
    unsigned char salt[MBEDTLS_MD_MAX_SIZE];
    size_t slen, min_slen, hlen, offset = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );
    RSA_VALIDATE_RET( sig != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    /* Calculate the largest possible salt length. Normally this is the hash
     * length, which is the maximum length the salt can have. If there is not
     * enough room, use the maximum salt length that fits. The constraint is
     * that the hash length plus the salt length plus 2 bytes must be at most
     * the key length. This complies with FIPS 186-4 §5.5 (e) and RFC 8017
     * (PKCS#1 v2.2) §9.1.1 step 3. */
    min_slen = hlen - 2;
    if( olen < hlen + min_slen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    else if( olen >= hlen + hlen + 2 )
        slen = hlen;
    else
        slen = olen - hlen - 2;

    memset( sig, 0, olen );

    /* Generate salt of length slen */
    if( ( ret = f_rng( p_rng, salt, slen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    /* Note: EMSA-PSS encoding is over the length of N - 1 bits */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    p += olen - hlen - slen - 2;
    *p++ = 0x01;
    memcpy( p, salt, slen );
    p += slen;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    /* Generate H = Hash( M' ) */
    if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, p, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, hash, hashlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, salt, slen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_finish( &md_ctx, p ) ) != 0 )
        goto exit;

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
        offset = 1;

    /* maskedDB: Apply dbMask to DB */
    if( ( ret = mgf_mask( sig + offset, olen - hlen - 1 - offset, p, hlen,
                          &md_ctx ) ) != 0 )
        goto exit;

    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    sig[0] &= 0xFF >> ( olen * 8 - msb );

    p += hlen;
    *p++ = 0xBC;

    mbedtls_platform_zeroize( salt, sizeof( salt ) );

exit:
    mbedtls_md_free( &md_ctx );

    if( ret != 0 )
        return( ret );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, sig, sig )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig ) );
}